

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O1

void __thiscall CCoinsViewDBCursor::Next(CCoinsViewDBCursor *this)

{
  bool bVar1;
  uint8_t uVar2;
  long in_FS_OFFSET;
  CoinEntry entry;
  CoinEntry local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CDBIterator::Next((this->pcursor)._M_t.
                    super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                    super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                    super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
  local_28.outpoint = &(this->keyTmp).second;
  local_28.key = 'C';
  bVar1 = CDBIterator::Valid((this->pcursor)._M_t.
                             super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                             .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
  uVar2 = '\0';
  if (bVar1) {
    bVar1 = CDBIterator::GetKey<(anonymous_namespace)::CoinEntry>
                      ((this->pcursor)._M_t.
                       super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                       super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                       super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&local_28);
    uVar2 = '\0';
    if (bVar1) {
      uVar2 = local_28.key;
    }
  }
  (this->keyTmp).first = uVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CCoinsViewDBCursor::Next()
{
    pcursor->Next();
    CoinEntry entry(&keyTmp.second);
    if (!pcursor->Valid() || !pcursor->GetKey(entry)) {
        keyTmp.first = 0; // Invalidate cached key after last record so that Valid() and GetKey() return false
    } else {
        keyTmp.first = entry.key;
    }
}